

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_nego(DisasContext_conflict10 *ctx)

{
  DisasContext_conflict10 *ctx_local;
  
  gen_op_arith_neg(ctx,true);
  return;
}

Assistant:

static void gen_nego(DisasContext *ctx)
{
    gen_op_arith_neg(ctx, 1);
}